

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::DiscreteQuantileFunction::Deserialize
          (DiscreteQuantileFunction *this,Deserializer *deserializer,AggregateFunction *function)

{
  pointer pFVar1;
  reference type;
  AggregateFunction AStack_148;
  
  QuantileBindData::Deserialize((Deserializer *)this,(AggregateFunction *)deserializer);
  pFVar1 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)this);
  type = vector<duckdb::LogicalType,_true>::get<true>
                   (&(function->super_BaseScalarFunction).super_SimpleFunction.arguments,0);
  if ((long)pFVar1[2]._vptr_FunctionData - (long)pFVar1[1]._vptr_FunctionData == 0x68) {
    GetAggregate(&AStack_148,type);
    AggregateFunction::operator=(function,&AStack_148);
  }
  else {
    DiscreteQuantileListFunction::GetAggregate(&AStack_148,type);
    AggregateFunction::operator=(function,&AStack_148);
  }
  AggregateFunction::~AggregateFunction(&AStack_148);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> Deserialize(Deserializer &deserializer, AggregateFunction &function) {
		auto bind_data = QuantileBindData::Deserialize(deserializer, function);
		auto &quantile_data = bind_data->Cast<QuantileBindData>();

		auto &input_type = function.arguments[0];
		if (quantile_data.quantiles.size() == 1) {
			function = GetAggregate(input_type);
		} else {
			function = DiscreteQuantileListFunction::GetAggregate(input_type);
		}
		return bind_data;
	}